

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O3

void __thiscall icu_63::UVector32::assign(UVector32 *this,UVector32 *other,UErrorCode *ec)

{
  int32_t *piVar1;
  int32_t *piVar2;
  UBool UVar3;
  long lVar4;
  int32_t minimumCapacity;
  
  minimumCapacity = other->count;
  if ((minimumCapacity < 0) || (this->capacity < minimumCapacity)) {
    UVar3 = expandCapacity(this,minimumCapacity,ec);
    if (UVar3 == '\0') {
      return;
    }
    minimumCapacity = other->count;
  }
  setSize(this,minimumCapacity);
  if (0 < other->count) {
    piVar1 = other->elements;
    piVar2 = this->elements;
    lVar4 = 0;
    do {
      piVar2[lVar4] = piVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 < other->count);
  }
  return;
}

Assistant:

void UVector32::assign(const UVector32& other, UErrorCode &ec) {
    if (ensureCapacity(other.count, ec)) {
        setSize(other.count);
        for (int32_t i=0; i<other.count; ++i) {
            elements[i] = other.elements[i];
        }
    }
}